

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O0

void soplex::LPFwriteRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *p_lp,ostream *p_output,NameSet *p_cnames,
                        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *p_svec,Rational *p_lhs,Rational *p_rhs,SPxOut *spxout)

{
  bool bVar1;
  bool bVar2;
  Verbosity VVar3;
  double *pdVar4;
  streamoff sVar5;
  ostream *in_RSI;
  double dVar6;
  SPxOut *in_stack_00000008;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  bool in_stack_000000af;
  SPxOut *in_stack_000000b0;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_000000b8;
  NameSet *in_stack_000000c0;
  longlong sidelen;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_000000d0;
  longlong pos;
  undefined4 in_stack_fffffffffffffee8;
  fmtflags in_stack_fffffffffffffeec;
  SPxOut *in_stack_fffffffffffffef0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffef8;
  undefined4 local_f8;
  Verbosity local_f4;
  fpos local_f0 [16];
  undefined1 local_e0 [16];
  undefined4 local_d0;
  Verbosity local_cc;
  undefined1 local_c8 [16];
  fpos local_b8 [19];
  byte local_a5;
  string local_98 [16];
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff80;
  string local_70 [32];
  long local_50;
  fpos local_48 [16];
  streamoff local_38;
  ostream *local_10;
  
  local_10 = in_RSI;
  local_48 = (fpos  [16])std::ostream::tellp();
  local_38 = std::fpos::operator_cast_to_long(local_48);
  LPFwriteSVector(in_stack_000000d0,(ostream *)sidelen,in_stack_000000c0,in_stack_000000b8,
                  in_stack_000000b0,in_stack_000000af);
  bVar1 = boost::multiprecision::operator==
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)0x133b16);
  bVar2 = false;
  local_a5 = 0;
  if (!bVar1) {
    dVar6 = boost::multiprecision::number::operator_cast_to_double
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)0x133b34);
    pdVar4 = (double *)infinity();
    if (-*pdVar4 < dVar6) {
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
      ::str_abi_cxx11_(in_stack_fffffffffffffef8,(streamsize)in_stack_fffffffffffffef0,
                       in_stack_fffffffffffffeec);
      local_a5 = 1;
      local_50 = std::__cxx11::string::length();
      goto LAB_00133bcf;
    }
  }
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
  ::str_abi_cxx11_(in_stack_fffffffffffffef8,(streamsize)in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffeec);
  bVar2 = true;
  local_50 = std::__cxx11::string::length();
LAB_00133bcf:
  if ((local_a5 & 1) != 0) {
    std::__cxx11::string::~string(local_98);
  }
  if (bVar2) {
    std::__cxx11::string::~string(local_70);
  }
  local_b8._0_16_ = std::ostream::tellp();
  sVar5 = std::fpos::operator_cast_to_long(local_b8);
  if (0x10000 < (sVar5 - local_38) + local_50 + 100) {
    std::operator<<(local_10,"\n\t");
    local_c8 = std::ostream::tellp();
    sVar5 = std::fpos::operator_cast_to_long((fpos *)local_c8);
    if ((0x10000 < sVar5 - local_38) && (in_stack_00000008 != (SPxOut *)0x0)) {
      VVar3 = SPxOut::getVerbosity(in_stack_00000008);
      if (0 < (int)VVar3) {
        local_cc = SPxOut::getVerbosity(in_stack_00000008);
        local_d0 = 1;
        (*in_stack_00000008->_vptr_SPxOut[2])(in_stack_00000008,&local_d0);
        operator<<(in_stack_fffffffffffffef0,
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        (*in_stack_00000008->_vptr_SPxOut[2])(in_stack_00000008,&local_cc);
      }
    }
    local_e0 = std::ostream::tellp();
    local_38 = std::fpos::operator_cast_to_long((fpos *)local_e0);
  }
  bVar2 = boost::multiprecision::operator==
                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)0x133d83);
  if (bVar2) {
    std::operator<<(local_10," = ");
    boost::multiprecision::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    in_stack_fffffffffffffef0 =
         (SPxOut *)
         boost::multiprecision::number::operator_cast_to_double
                   ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x133dbf);
    pdVar4 = (double *)infinity();
    if (-*pdVar4 < (double)in_stack_fffffffffffffef0) {
      std::operator<<(local_10," >= ");
      boost::multiprecision::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      std::operator<<(local_10," <= ");
      boost::multiprecision::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  std::operator<<(local_10,"\n");
  local_f0 = (fpos  [16])std::ostream::tellp();
  sVar5 = std::fpos::operator_cast_to_long(local_f0);
  if ((0x10000 < sVar5 - local_38) && (in_stack_00000008 != (SPxOut *)0x0)) {
    VVar3 = SPxOut::getVerbosity(in_stack_00000008);
    if (0 < (int)VVar3) {
      local_f4 = SPxOut::getVerbosity(in_stack_00000008);
      local_f8 = 1;
      (*in_stack_00000008->_vptr_SPxOut[2])(in_stack_00000008,&local_f8);
      operator<<(in_stack_fffffffffffffef0,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      (*in_stack_00000008->_vptr_SPxOut[2])(in_stack_00000008,&local_f4);
    }
  }
  return;
}

Assistant:

static void LPFwriteRow(
   const SPxLPBase<Rational>&   p_lp,       ///< the LP
   std::ostream&            p_output,   ///< output stream
   const NameSet*           p_cnames,   ///< column names
   const SVectorBase<Rational>& p_svec,     ///< vector of the row
   const Rational&              p_lhs,      ///< lhs of the row
   const Rational&              p_rhs,      ///< rhs of the row
   SPxOut*                      spxout      ///< out stream
)
{

   long long pos;
   pos = p_output.tellp();

   LPFwriteSVector(p_lp, p_output, p_cnames, p_svec, spxout);

   long long sidelen;
   sidelen = (p_lhs == p_rhs
              || double(p_lhs) <= double(-infinity)) ? (long long)p_rhs.str().length()
             : (long long)p_lhs.str().length();

   // insert a line break if max line length is in danger of being exceeded
   if((long long)(p_output.tellp()) - pos + sidelen + (long long)100 > SOPLEX_MAX_LINE_WRITE_LEN)
   {
      p_output << "\n\t";

      if((long long)(p_output.tellp()) - pos  >  SOPLEX_MAX_LINE_WRITE_LEN)
      {
         SPX_MSG_WARNING((*spxout), (*spxout) <<
                         "XLPSWR02 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n");
      }

      pos = p_output.tellp();
   }

   // write bound value
   if(p_lhs == p_rhs)
      p_output << " = " << p_rhs;
   else if(double(p_lhs) <= double(-infinity))
      p_output << " <= " << p_rhs;
   else
   {
      assert(double(p_rhs) >= double(infinity));
      p_output << " >= " << p_lhs;
   }

   p_output << "\n";

   if((long long)(p_output.tellp()) - pos  >  SOPLEX_MAX_LINE_WRITE_LEN)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XLPSWR03 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n");
   }
}